

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_exp.h
# Opt level: O0

type __thiscall
dlib::matrix_exp::operator_cast_to_double
          (matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>,_dlib::matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
           *this)

{
  double *pdVar1;
  matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>,_dlib::matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  *in_RDI;
  matrix<double,_1L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *unaff_retaddr;
  matrix<double,_1L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp
  ;
  long in_stack_ffffffffffffffe8;
  matrix<double,_1L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *in_stack_fffffffffffffff0;
  
  matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>,_dlib::matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  ::ref(in_RDI);
  matrix<double,1l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>::
  matrix<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix<double,3l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>,dlib::matrix<double,3l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>
            (unaff_retaddr,in_RDI);
  pdVar1 = matrix<double,_1L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
           ::operator()(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return *pdVar1;
}

Assistant:

inline operator const type (
        ) const 
        {
            COMPILE_TIME_ASSERT(NC == 1 || NC == 0);
            COMPILE_TIME_ASSERT(NR == 1 || NR == 0);
            DLIB_ASSERT(nr() == 1 && nc() == 1, 
                "\tmatrix_exp::operator const type() const"
                << "\n\tYou can only use this operator on a 1x1 matrix"
                << "\n\tnr(): " << nr()
                << "\n\tnc(): " << nc()
                << "\n\tthis: " << this
                );

            // Put the expression contained in this matrix_exp into
            // a temporary 1x1 matrix so that the expression will encounter
            // all the overloads of matrix_assign() and have the chance to
            // go through any applicable optimizations.
            matrix<type,1,1,mem_manager_type,layout_type> temp(ref());
            return temp(0);
        }